

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O0

Vector<float,_2> __thiscall tcu::normalize<float,2>(tcu *this,Vector<float,_2> *a)

{
  Vector<float,_2> VVar1;
  Type_conflict TVar2;
  float extraout_XMM0_Da;
  float fVar3;
  float extraout_XMM0_Db;
  float fVar4;
  int local_20;
  int i;
  float ooLen;
  Vector<float,_2> *a_local;
  Vector<float,_2> *res;
  
  TVar2 = length<float,2>(a);
  Vector<float,_2>::Vector((Vector<float,_2> *)this);
  fVar3 = extraout_XMM0_Da;
  fVar4 = extraout_XMM0_Db;
  for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
    fVar4 = 0.0;
    fVar3 = (1.0 / TVar2) * a->m_data[local_20];
    *(float *)(this + (long)local_20 * 4) = fVar3;
  }
  VVar1.m_data[1] = fVar4;
  VVar1.m_data[0] = fVar3;
  return (Vector<float,_2>)VVar1.m_data;
}

Assistant:

inline Vector<T, Size> normalize (const Vector<T, Size>& a)
{
	T ooLen = T(1) / length(a);
	Vector<T, Size> res;
	for (int i = 0; i < Size; i++)
		res.m_data[i] = ooLen * a.m_data[i];
	return res;
}